

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_execSequenceEnd
                 (BYTE *op,BYTE *oend,seq_t sequence,BYTE **litPtr,BYTE *litLimit,BYTE *prefixStart,
                 BYTE *virtualStart,BYTE *dictEnd)

{
  BYTE *pBVar1;
  size_t __n;
  size_t length1;
  BYTE *oend_w;
  BYTE *match;
  BYTE *iLitEnd;
  BYTE *oMatchEnd;
  size_t sequenceLength;
  BYTE *oLitEnd;
  BYTE *virtualStart_local;
  BYTE *prefixStart_local;
  BYTE *litLimit_local;
  BYTE **litPtr_local;
  BYTE *oend_local;
  BYTE *op_local;
  
  oend_local = op + sequence.litLength;
  op_local = (BYTE *)(sequence.litLength + sequence.matchLength);
  pBVar1 = *litPtr;
  oend_w = oend_local + -sequence.offset;
  if (op + (long)op_local <= oend_local) {
    __assert_fail("oLitEnd < oMatchEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x635b,
                  "size_t ZSTD_execSequenceEnd(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                 );
  }
  if (oend < op + (long)op_local) {
    op_local = (BYTE *)0xffffffffffffffba;
  }
  else if (litLimit < pBVar1 + sequence.litLength) {
    op_local = (BYTE *)0xffffffffffffffec;
  }
  else {
    ZSTD_safecopy(op,oend + -0x20,*litPtr,sequence.litLength,ZSTD_no_overlap);
    *litPtr = pBVar1 + sequence.litLength;
    if ((ulong)((long)oend_local - (long)prefixStart) < sequence.offset) {
      if ((ulong)((long)oend_local - (long)virtualStart) < sequence.offset) {
        return 0xffffffffffffffec;
      }
      pBVar1 = dictEnd + -((long)prefixStart - (long)oend_w);
      if (pBVar1 + sequence.matchLength <= dictEnd) {
        memmove(oend_local,pBVar1,sequence.matchLength);
        return (size_t)op_local;
      }
      __n = (long)dictEnd - (long)pBVar1;
      memmove(oend_local,pBVar1,__n);
      oend_local = oend_local + __n;
      sequence.matchLength = sequence.matchLength - __n;
      oend_w = prefixStart;
    }
    ZSTD_safecopy(oend_local,oend + -0x20,oend_w,sequence.matchLength,ZSTD_overlap_src_before_dst);
  }
  return (size_t)op_local;
}

Assistant:

FORCE_NOINLINE
size_t ZSTD_execSequenceEnd(BYTE* op,
                            BYTE* const oend, seq_t sequence,
                            const BYTE** litPtr, const BYTE* const litLimit,
                            const BYTE* const prefixStart, const BYTE* const virtualStart, const BYTE* const dictEnd)
{
    BYTE* const oLitEnd = op + sequence.litLength;
    size_t const sequenceLength = sequence.litLength + sequence.matchLength;
    BYTE* const oMatchEnd = op + sequenceLength;   /* risk : address space overflow (32-bits) */
    const BYTE* const iLitEnd = *litPtr + sequence.litLength;
    const BYTE* match = oLitEnd - sequence.offset;
    BYTE* const oend_w = oend - WILDCOPY_OVERLENGTH;

    /* bounds checks */
    assert(oLitEnd < oMatchEnd);
    RETURN_ERROR_IF(oMatchEnd > oend, dstSize_tooSmall, "last match must fit within dstBuffer");
    RETURN_ERROR_IF(iLitEnd > litLimit, corruption_detected, "try to read beyond literal buffer");

    /* copy literals */
    ZSTD_safecopy(op, oend_w, *litPtr, sequence.litLength, ZSTD_no_overlap);
    op = oLitEnd;
    *litPtr = iLitEnd;

    /* copy Match */
    if (sequence.offset > (size_t)(oLitEnd - prefixStart)) {
        /* offset beyond prefix */
        RETURN_ERROR_IF(sequence.offset > (size_t)(oLitEnd - virtualStart), corruption_detected);
        match = dictEnd - (prefixStart-match);
        if (match + sequence.matchLength <= dictEnd) {
            memmove(oLitEnd, match, sequence.matchLength);
            return sequenceLength;
        }
        /* span extDict & currentPrefixSegment */
        {   size_t const length1 = dictEnd - match;
            memmove(oLitEnd, match, length1);
            op = oLitEnd + length1;
            sequence.matchLength -= length1;
            match = prefixStart;
    }   }
    ZSTD_safecopy(op, oend_w, match, sequence.matchLength, ZSTD_overlap_src_before_dst);
    return sequenceLength;
}